

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  int local_34;
  bool is_tab_stop;
  ImGuiContext *g;
  ImGuiID id_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  bVar2 = ((window->DC).ItemFlags & 5U) == 0;
  (window->DC).FocusCounterAll = (window->DC).FocusCounterAll + 1;
  if (bVar2) {
    (window->DC).FocusCounterTab = (window->DC).FocusCounterTab + 1;
  }
  if ((((pIVar1->ActiveId == id) && ((pIVar1->FocusTabPressed & 1U) != 0)) &&
      ((pIVar1->ActiveIdBlockNavInputFlags & 0x20000U) == 0)) &&
     (pIVar1->FocusRequestNextWindow == (ImGuiWindow *)0x0)) {
    pIVar1->FocusRequestNextWindow = window;
    if (((pIVar1->IO).KeyShift & 1U) == 0) {
      local_34 = 1;
    }
    else {
      local_34 = 0;
      if (bVar2) {
        local_34 = -1;
      }
    }
    pIVar1->FocusRequestNextCounterTab = (window->DC).FocusCounterTab + local_34;
  }
  if (pIVar1->FocusRequestCurrWindow == window) {
    if ((window->DC).FocusCounterAll == pIVar1->FocusRequestCurrCounterAll) {
      return true;
    }
    if ((bVar2) && ((window->DC).FocusCounterTab == pIVar1->FocusRequestCurrCounterTab)) {
      pIVar1->NavJustTabbedId = id;
      return true;
    }
    if (pIVar1->ActiveId == id) {
      ClearActiveID();
    }
  }
  return false;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;

    // Increment counters
    const bool is_tab_stop = (window->DC.ItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->DC.FocusCounterAll++;
    if (is_tab_stop)
        window->DC.FocusCounterTab++;

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.FocusTabPressed && !(g.ActiveIdBlockNavInputFlags & (1 << ImGuiNavInput_KeyTab_)) && g.FocusRequestNextWindow == NULL)
    {
        g.FocusRequestNextWindow = window;
        g.FocusRequestNextCounterTab = window->DC.FocusCounterTab + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.FocusRequestCurrWindow == window)
    {
        if (window->DC.FocusCounterAll == g.FocusRequestCurrCounterAll)
            return true;
        if (is_tab_stop && window->DC.FocusCounterTab == g.FocusRequestCurrCounterTab)
        {
            g.NavJustTabbedId = id;
            return true;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }

    return false;
}